

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double empirical_discrete_variance(int a,double *b,double *c)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = r8vec_sum(a,b);
  dVar4 = 0.0;
  if (0 < a) {
    uVar1 = 0;
    do {
      dVar4 = dVar4 + b[uVar1] * c[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)a != uVar1);
  }
  dVar3 = r8vec_sum(a,b);
  dVar6 = 0.0;
  if (0 < a) {
    uVar1 = 0;
    do {
      dVar5 = c[uVar1] - dVar4 / dVar3;
      dVar6 = dVar6 + dVar5 * dVar5 * (b[uVar1] / dVar2);
      uVar1 = uVar1 + 1;
    } while ((uint)a != uVar1);
  }
  return dVar6;
}

Assistant:

double empirical_discrete_variance ( int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_VARIANCE returns the variance of the Empirical Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_VARIANCE, the variance of the PDF.
//
{
  double bsum;
  int i;
  double mean;
  double variance;

  bsum = r8vec_sum ( a, b );

  mean = empirical_discrete_mean ( a, b, c );

  variance = 0.0;

  for ( i = 0; i < a; i++ )
  {
    variance = variance + ( b[i] / bsum ) * pow ( c[i] - mean, 2 );
  }

  return variance;
}